

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

int cs_impl::fiber::resume(routine_t id)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  
  lVar2 = ordinator();
  if (*(int *)(lVar2 + 0x30) == 0) {
    plVar3 = (long *)ordinator();
    lVar2 = *(long *)(*plVar3 + (ulong)(id - 1) * 8);
    if (lVar2 == 0) {
      iVar1 = -1;
    }
    else if (*(char *)(lVar2 + 0x68) == '\0') {
      if (*(long *)(lVar2 + 0x60) == 0) {
        lVar4 = lVar2 + 0x70;
        getcontext(lVar4);
        lVar5 = ordinator();
        pvVar6 = operator_new__(*(ulong *)(lVar5 + 0x38));
        *(void **)(lVar2 + 0x60) = pvVar6;
        *(void **)(lVar2 + 0x80) = pvVar6;
        lVar5 = ordinator();
        *(undefined8 *)(lVar2 + 0x90) = *(undefined8 *)(lVar5 + 0x38);
        lVar5 = ordinator();
        *(long *)(lVar2 + 0x78) = lVar5 + 0x40;
        lVar5 = ordinator();
        *(routine_t *)(lVar5 + 0x30) = id;
        makecontext(lVar4,entry,0);
        cs::current_process = *(undefined **)(lVar2 + 8);
        **(long **)(*(long *)(**(long **)(lVar2 + 0x38) + 0x10) + 0x110) = lVar2 + 0x10;
        lVar2 = ordinator();
        swapcontext(lVar2 + 0x40,lVar4);
        iVar1 = 0;
      }
      else {
        lVar4 = ordinator();
        *(routine_t *)(lVar4 + 0x30) = id;
        cs::current_process = *(undefined **)(lVar2 + 8);
        **(long **)(*(long *)(**(long **)(lVar2 + 0x38) + 0x10) + 0x110) = lVar2 + 0x10;
        lVar4 = ordinator();
        swapcontext(lVar4 + 0x40,lVar2 + 0x70);
        iVar1 = 0;
      }
    }
    else {
      iVar1 = -2;
    }
    return iVar1;
  }
  __assert_fail("ordinator.current == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                ,0x157,"int cs_impl::fiber::resume(routine_t)");
}

Assistant:

int resume(routine_t id)
		{
			assert(ordinator.current == 0);

			Routine *routine = ordinator.routines[id - 1];
			if (routine == nullptr)
				return -1;

			if (routine->finished)
				return -2;

			if (routine->stack == nullptr) {
				//initializes the structure to the currently active context.
				//When successful, getcontext() returns 0
				//On error, return -1 and set errno appropriately.
				cs_fiber_getcontext(&routine->ctx);

				//Before invoking makecontext(), the caller must allocate a new stack
				//for this context and assign its address to ucp->uc_stack,
				//and define a successor context and assign its address to ucp->uc_link.
				routine->stack = new char[ordinator.stack_size];
				routine->ctx.uc_stack.ss_sp = routine->stack;
				routine->ctx.uc_stack.ss_size = ordinator.stack_size;
				routine->ctx.uc_link = &ordinator.ctx;
				ordinator.current = id;

				//When this context is later activated by swapcontext(), the function entry is called.
				//When this function returns, the  successor context is activated.
				//If the successor context pointer is NULL, the thread exits.
				cs_fiber_makecontext(&routine->ctx, reinterpret_cast<void (*)(void)>(entry), 0);

				//The swapcontext() function saves the current context,
				//and then activates the context of another.
				cs::current_process = routine->cs_pcontext.get();
				routine->cs_context->instance->swap_context(&routine->cs_stack);
				cs_fiber_swapcontext(&ordinator.ctx, &routine->ctx);
			}
			else {
				ordinator.current = id;
				cs::current_process = routine->cs_pcontext.get();
				routine->cs_context->instance->swap_context(&routine->cs_stack);
				cs_fiber_swapcontext(&ordinator.ctx, &routine->ctx);
			}

			return 0;
		}